

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objAppend(void *dest,void *src,size_t i)

{
  long in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t t;
  void *in_stack_ffffffffffffffd8;
  void *dest_00;
  
  dest_00 = (void *)*in_RSI;
  objCopy(dest_00,in_stack_ffffffffffffffd8);
  in_RDI[in_RDX + 3] = (long)in_RDI + *in_RDI;
  *in_RDI = (long)dest_00 + *in_RDI;
  return;
}

Assistant:

void objAppend(void* dest, const void* src, size_t i)
{
	size_t t;
	// pre
	ASSERT(objIsOperable(src));
	ASSERT(objIsOperable(dest));
	ASSERT(memIsValid(objEnd(dest, void), objKeep(src)));
	ASSERT(i < objOCount(dest));
	// запомнить размер src
	t = objKeep(src);
	// скопировать src в конец dest
	objCopy(objEnd(dest, void), src);
	// установить ссылку на конец dest
	objPtr(dest, i, void) = objEnd(dest, void);
	// расширить dest
	objHdr(dest)->keep += t;
}